

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O0

void __thiscall QMdiSubWindowPrivate::setNewWindowTitle(QMdiSubWindowPrivate *this)

{
  bool bVar1;
  QWidget *this_00;
  QMdiSubWindowPrivate *in_RDI;
  long in_FS_OFFSET;
  QMdiSubWindow *q;
  type title;
  QString original;
  QString childTitle;
  undefined4 in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  uint n;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  QMdiSubWindowPrivate *this_01;
  QWidget *in_stack_ffffffffffffff60;
  QString *in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff88;
  QChar fillChar;
  QChar local_6a [25];
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  fillChar.ucs = (char16_t)((ulong)in_stack_ffffffffffffff88 >> 0x30);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  this_00 = &q_func(in_RDI)->super_QWidget;
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QWidget::windowTitle((QWidget *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  bVar1 = QString::isEmpty((QString *)0x62a4d1);
  if (!bVar1) {
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    local_30 = &DAT_aaaaaaaaaaaaaaaa;
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    originalWindowTitle(this_01);
    bVar1 = QString::isEmpty((QString *)0x62a530);
    if (bVar1) {
      in_RDI->ignoreWindowTitleChange = true;
      QWidget::window(this_00);
      QWidget::setWindowTitle(in_stack_ffffffffffffff60,(QString *)this_01);
      in_RDI->ignoreWindowTitleChange = false;
    }
    else {
      QMdiSubWindow::tr((char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                        (char *)in_RDI,in_stack_ffffffffffffff3c);
      QChar::QChar<char16_t,_true>(local_6a,L' ');
      QString::arg<QString,_true>
                ((QString *)in_stack_ffffffffffffff60,(QString *)this_01,
                 (int)((ulong)this_00 >> 0x20),fillChar);
      bVar1 = QString::contains((QString *)in_RDI,
                                (QString *)
                                CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                                CaseInsensitive);
      n = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff3c) ^ 0xff000000;
      QString::~QString((QString *)0x62a5a7);
      QString::~QString((QString *)0x62a5b1);
      if ((n & 0x1000000) != 0) {
        QMdiSubWindow::tr((char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                          (char *)in_RDI,n);
        QString::arg<QString&,QString&>
                  (in_stack_ffffffffffffff68,(QString *)in_stack_ffffffffffffff60,(QString *)this_01
                  );
        QString::~QString((QString *)0x62a625);
        in_RDI->ignoreWindowTitleChange = true;
        QWidget::window(this_00);
        QWidget::setWindowTitle(in_stack_ffffffffffffff60,(QString *)this_01);
        in_RDI->ignoreWindowTitleChange = false;
        QString::~QString((QString *)0x62a65e);
      }
    }
    QString::~QString((QString *)0x62a69f);
  }
  QString::~QString((QString *)0x62a6b4);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMdiSubWindowPrivate::setNewWindowTitle()
{
    Q_Q(QMdiSubWindow);
    QString childTitle = q->windowTitle();
    if (childTitle.isEmpty())
        return;
    QString original = originalWindowTitle();
    if (!original.isEmpty()) {
        if (!original.contains(QMdiSubWindow::tr("- [%1]").arg(childTitle))) {
            auto title = QMdiSubWindow::tr("%1 - [%2]").arg(original, childTitle);
            ignoreWindowTitleChange = true;
            q->window()->setWindowTitle(title);
            ignoreWindowTitleChange = false;
        }

    } else {
        ignoreWindowTitleChange = true;
        q->window()->setWindowTitle(childTitle);
        ignoreWindowTitleChange = false;
    }
}